

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleTypeHandler<3UL>::GetPropertyEquivalenceInfo
          (SimpleTypeHandler<3UL> *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info
          )

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ushort uVar5;
  uint in_EAX;
  ulong uVar6;
  PropertyIndex PVar7;
  uint uVar9;
  ushort uVar8;
  
  iVar2 = this->propertyCount;
  bVar4 = 0 < iVar2;
  if (0 < iVar2) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyRecord->pid) {
      bVar4 = true;
      in_EAX = 0;
    }
    else {
      uVar3 = 1;
      do {
        in_EAX = uVar3;
        uVar9 = in_EAX & 0xffff;
        bVar4 = (int)uVar9 < iVar2;
        if (iVar2 <= (int)uVar9) break;
        uVar3 = uVar9 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar9 << 4)) + 8) !=
               propertyRecord->pid);
    }
  }
  if ((bVar4) &&
     (uVar6 = (ulong)((in_EAX & 0xffff) << 4),
     (*(byte *)((long)&this->descriptors[0].field_1 + uVar6) & 8) == 0)) {
    uVar5 = (ushort)in_EAX;
    if (uVar5 == 0xffff) {
      PVar7 = 0xffff;
    }
    else {
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar8 = -uVar1;
      if (uVar5 < uVar1) {
        uVar8 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      PVar7 = uVar8 + uVar5;
    }
    info->slotIndex = PVar7;
    info->isWritable = (bool)(*(byte *)((long)&this->descriptors[0].field_1 + uVar6) >> 2 & 1);
    bVar4 = true;
  }
  else {
    info->slotIndex = 0xffff;
    info->isWritable = true;
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SimpleTypeHandler<size>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            info.slotIndex = AdjustSlotIndexForInlineSlots((PropertyIndex)index);
            info.isWritable = !!(descriptors[index].Attributes & PropertyWritable);
            return true;
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isWritable = true;
            return false;
        }
    }